

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VTuneChakraProfile.cpp
# Opt level: O0

utf8char_t * VTuneChakraProfile::GetUrl(FunctionBody *body,size_t *urlBufferLength)

{
  bool bVar1;
  uint32 uVar2;
  SourceContextInfo *pSVar3;
  uint *puVar4;
  Memory *this;
  TrackAllocData local_60;
  uint local_38;
  uint local_34;
  uint uStack_30;
  charcount_t ccUrlCharLength;
  size_t urlCharLength;
  wchar *url;
  utf8char_t *utf8Url;
  size_t *urlBufferLength_local;
  FunctionBody *body_local;
  
  url = (wchar *)0x0;
  utf8Url = (utf8char_t *)urlBufferLength;
  urlBufferLength_local = (size_t *)body;
  pSVar3 = Js::FunctionProxy::GetSourceContextInfo((FunctionProxy *)body);
  bVar1 = SourceContextInfo::IsDynamic(pSVar3);
  if (bVar1) {
    url = L"Dynamic code";
  }
  else {
    pSVar3 = Js::FunctionProxy::GetSourceContextInfo((FunctionProxy *)urlBufferLength_local);
    urlCharLength = (size_t)(pSVar3->field_5).field_0.url;
    if ((char16_t *)urlCharLength != (char16_t *)0x0) {
      _uStack_30 = PAL_wcslen((char16_t *)urlCharLength);
      local_34 = uStack_30;
      local_38 = 0xffffffff;
      puVar4 = min<unsigned_int>(&local_34,&local_38);
      local_34 = *puVar4;
      uVar2 = UInt32Math::MulAdd<3u,1u>(local_34);
      *(ulong *)utf8Url = (ulong)uVar2;
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_60,(type_info *)&unsigned_char::typeinfo,0,*(size_t *)utf8Url,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/VTuneChakraProfile.cpp"
                 ,0xb0);
      this = (Memory *)
             Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_60);
      url = (wchar *)Memory::AllocateArray<Memory::HeapAllocator,unsigned_char,true>
                               (this,(HeapAllocator *)Memory::HeapAllocator::NoThrowAlloc,0,
                                *(size_t *)utf8Url);
      if (url != (wchar *)0x0) {
        utf8::EncodeIntoAndNullTerminate<(utf8::Utf8EncodingKind)0>
                  ((utf8char_t *)url,*(size_t *)utf8Url,(char16 *)urlCharLength,local_34);
      }
    }
  }
  return (utf8char_t *)url;
}

Assistant:

utf8char_t* VTuneChakraProfile::GetUrl(Js::FunctionBody* body, size_t* urlBufferLength )
{
    utf8char_t* utf8Url = NULL;
    if (!body->GetSourceContextInfo()->IsDynamic())
    {
        const wchar* url = body->GetSourceContextInfo()->url;
        if (url)
        {
            size_t urlCharLength = wcslen(url);
            charcount_t ccUrlCharLength = static_cast<charcount_t>(urlCharLength);
            ccUrlCharLength = min(ccUrlCharLength, UINT_MAX);       // Just truncate if it is too big

            *urlBufferLength = UInt32Math::MulAdd<3, 1>(ccUrlCharLength);
            utf8Url = HeapNewNoThrowArray(utf8char_t, *urlBufferLength);
            if (utf8Url)
            {
                utf8::EncodeIntoAndNullTerminate<utf8::Utf8EncodingKind::Cesu8>(utf8Url, *urlBufferLength, url, ccUrlCharLength);
            }
        }
    }
    else
    {
        utf8Url = (utf8char_t*)VTuneChakraProfile::DynamicCode;
    }
    return utf8Url;
}